

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>
::disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>
              *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>
    ::~ImmediatePromiseNode
              ((ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>::Connection>_>
                *)pointer);
    operator_delete(pointer,0x178);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }